

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

double dd_ev(long ndims,Integer *ardims,Integer *pedims)

{
  long k;
  double t;
  double q;
  Integer *pedims_local;
  Integer *ardims_local;
  long ndims_local;
  
  t = 1.0;
  for (k = 0; k < ndims; k = k + 1) {
    t = t * ((double)((ardims[k] / pedims[k]) * pedims[k]) / (double)ardims[k]);
  }
  return t;
}

Assistant:

double dd_ev(long ndims,Integer ardims[], Integer pedims[])
      {
      double q, t;
      long k;
      q = 1.0;
      t = 1.0;
      for(k=0;k<ndims;k++){
          q = (ardims[k]/pedims[k])*pedims[k];
          t = t*(q/(double)ardims[k]);
      }
      return t;
      }